

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3ExprLocalHitsCb(Fts3Expr *pExpr,int iPhrase,void *pCtx)

{
  int iVar1;
  int iVar2;
  char *in_RAX;
  int iVar3;
  long lVar4;
  char *pCsr;
  char *local_38;
  
  iVar2 = *(int *)((long)pCtx + 8);
  iVar3 = iPhrase * iVar2 * 3;
  lVar4 = 0;
  iVar1 = 0;
  local_38 = in_RAX;
  while ((lVar4 < iVar2 && (iVar1 == 0))) {
    iVar1 = sqlite3Fts3EvalPhrasePoslist(*pCtx,pExpr,(int)lVar4,&local_38);
    if (local_38 == (char *)0x0) {
      iVar2 = 0;
    }
    else {
      iVar2 = fts3ColumnlistCount(&local_38);
    }
    *(int *)(*(long *)((long)pCtx + 0x20) + (long)iVar3 * 4) = iVar2;
    lVar4 = lVar4 + 1;
    iVar2 = *(int *)((long)pCtx + 8);
    iVar3 = iVar3 + 3;
  }
  return iVar1;
}

Assistant:

static int fts3ExprLocalHitsCb(
  Fts3Expr *pExpr,                /* Phrase expression node */
  int iPhrase,                    /* Phrase number */
  void *pCtx                      /* Pointer to MatchInfo structure */
){
  int rc = SQLITE_OK;
  MatchInfo *p = (MatchInfo *)pCtx;
  int iStart = iPhrase * p->nCol * 3;
  int i;

  for(i=0; i<p->nCol && rc==SQLITE_OK; i++){
    char *pCsr;
    rc = sqlite3Fts3EvalPhrasePoslist(p->pCursor, pExpr, i, &pCsr);
    if( pCsr ){
      p->aMatchinfo[iStart+i*3] = fts3ColumnlistCount(&pCsr);
    }else{
      p->aMatchinfo[iStart+i*3] = 0;
    }
  }

  return rc;
}